

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O0

void __thiscall hdc::CppPrinter::generatePrototype(CppPrinter *this,Def *def)

{
  Type *pTVar1;
  ostream *poVar2;
  undefined1 local_38 [40];
  Def *def_local;
  CppPrinter *this_local;
  
  local_38._32_8_ = def;
  def_local = (Def *)this;
  pTVar1 = Def::getReturnType(def);
  (**(pTVar1->super_ASTNode)._vptr_ASTNode)(pTVar1,this);
  poVar2 = std::operator<<((ostream *)&this->field_0x20," ");
  Def::getUniqueCppName_abi_cxx11_((Def *)local_38);
  poVar2 = std::operator<<(poVar2,(string *)local_38);
  std::operator<<(poVar2,"(");
  std::__cxx11::string::~string((string *)local_38);
  generateDefParameters(this,(Def *)local_38._32_8_);
  std::operator<<((ostream *)&this->field_0x20,");\n");
  return;
}

Assistant:

void CppPrinter::generatePrototype(Def* def) {
    def->getReturnType()->accept(this);
    output << " " << def->getUniqueCppName() << "(";

    generateDefParameters(def);
    output << ");\n";
}